

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<const_char_*const> * __thiscall
kj::heapArray<char_const*const,char_const*const*>
          (Array<const_char_*const> *__return_storage_ptr__,kj *this,char **begin,char **end)

{
  undefined1 local_40 [8];
  ArrayBuilder<const_char_*const> builder;
  char **end_local;
  char **begin_local;
  
  builder.disposer = (ArrayDisposer *)begin;
  heapArrayBuilder<char_const*const>
            ((ArrayBuilder<const_char_*const> *)local_40,(kj *)((long)begin - (long)this >> 3),
             (size_t)begin);
  ArrayBuilder<char_const*const>::addAll<char_const*const*,false>
            ((ArrayBuilder<char_const*const> *)local_40,(char **)this,(char **)builder.disposer);
  ArrayBuilder<const_char_*const>::finish
            (__return_storage_ptr__,(ArrayBuilder<const_char_*const> *)local_40);
  ArrayBuilder<const_char_*const>::~ArrayBuilder((ArrayBuilder<const_char_*const> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}